

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O1

void __thiscall
google::protobuf::internal::MapFieldBase::InitializeKeyValue(MapFieldBase *this,MessageLite *msg)

{
  MessageLite *prototype_for_func;
  int iVar1;
  FieldDescriptor *field;
  Message *pMVar2;
  undefined4 extraout_var;
  Arena *arena;
  Metadata MVar3;
  Metadata MVar4;
  
  pMVar2 = (Message *)(this->super_MapFieldBaseForParse).prototype_as_void_;
  MVar3 = Message::GetMetadata(pMVar2);
  MVar4 = Message::GetMetadata(pMVar2);
  field = Descriptor::map_value(MVar4.descriptor);
  pMVar2 = Reflection::GetMessage(MVar3.reflection,pMVar2,field,(MessageFactory *)0x0);
  iVar1 = (*(pMVar2->super_MessageLite)._vptr_MessageLite[4])(pMVar2);
  arena = MapFieldBase::arena(this);
  prototype_for_func = *(MessageLite **)CONCAT44(extraout_var,iVar1);
  MessageCreator::PlacementNew<false,google::protobuf::MessageLite>
            ((MessageCreator *)((undefined8 *)CONCAT44(extraout_var,iVar1) + 5),prototype_for_func,
             prototype_for_func,msg,arena);
  return;
}

Assistant:

void InitializeKeyValue(MessageLite* msg) {
    GetClassData(GetMapEntryValuePrototype(*GetPrototype()))
        ->PlacementNew(msg, arena());
  }